

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

void checkformat(lua_State *L,char *form,char *flags,int precision)

{
  size_t sVar1;
  ushort **ppuVar2;
  byte *s;
  
  sVar1 = strspn(form + 1,flags);
  s = (byte *)(form + sVar1 + 1);
  if (*s != 0x30) {
    s = (byte *)get2digits((char *)s);
    if ((precision != 0) && (*s == 0x2e)) {
      s = (byte *)get2digits((char *)(s + 1));
    }
  }
  ppuVar2 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar2 + (ulong)*s * 2 + 1) & 4) == 0) {
    luaL_error(L,"invalid conversion specification: \'%s\'",form);
    return;
  }
  return;
}

Assistant:

static void checkformat (lua_State *L, const char *form, const char *flags,
                                       int precision) {
  const char *spec = form + 1;  /* skip '%' */
  spec += strspn(spec, flags);  /* skip flags */
  if (*spec != '0') {  /* a width cannot start with '0' */
    spec = get2digits(spec);  /* skip width */
    if (*spec == '.' && precision) {
      spec++;
      spec = get2digits(spec);  /* skip precision */
    }
  }
  if (!isalpha(uchar(*spec)))  /* did not go to the end? */
    luaL_error(L, "invalid conversion specification: '%s'", form);
}